

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.cpp
# Opt level: O1

void SignalHandler(int signal,siginfo_t *sigInfo,void *context)

{
  char *__s;
  uint uVar1;
  ostream *poVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long *in_FS_OFFSET;
  
  if ((sigInfo->_sifields)._pad[2] != 0x42424242) {
    pthread_mutex_lock((pthread_mutex_t *)&gHandlerLock);
    if ((char)in_FS_OFFSET[-1] == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Oops! Something went wrong in the simulation library",0x34);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Exception ",10);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,signal);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," occured at ",0xc);
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    uVar1 = backtrace(gBuffer,0x100);
    if (uVar1 == 0) {
      uVar4 = 0;
    }
    else {
      sigInfo = (siginfo_t *)backtrace_symbols(gBuffer,uVar1);
      uVar4 = 0;
      if (sigInfo != (siginfo_t *)0x0) {
        uVar4 = uVar1;
      }
    }
    if (0 < (int)uVar4) {
      uVar5 = (ulong)uVar4;
      uVar6 = 0;
      do {
        uVar4 = uVar4 - 1;
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,uVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
        __s = *(char **)(&sigInfo->si_signo + uVar6 * 2);
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
        }
        else {
          sVar3 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&gHandlerLock);
    free(sigInfo);
  }
  if ((char)in_FS_OFFSET[-1] == '\x01') {
    longjmp((__jmp_buf_tag *)(*in_FS_OFFSET + -0xd0),signal);
  }
  return;
}

Assistant:

void SignalHandler(int signal, siginfo_t * sigInfo, void * context)
{
    UNUSED_PARAMETER(context);

    /* If the signal wasn't sent on purpose by ourselves, then, it indicates
     * a broken behavior in either HPCsim or the called simulation.
     * We'll have to provide a backtrace to help debugging.
     */
    if (sigInfo->si_int != HPCSIM_MAGIC_MARKER)
    {
        char ** strings;
        int numberAddresses, trace;

        /* Lock the handler lock for two reasons:
         * First, we don't want to have a race condition accessing standard error
         * Our backtrace must be crystal clear
         * Second, the gBuffer is shared between all the instances of the handler
         * so, make sure it is only used by one at a time
         */
        pthread_mutex_lock(&gHandlerLock);

        /* If the signal occured while in a try block, it is the simulation shared object
         * which is failing. Inform the user
         */
        if (gInTry)
        {
            std::cerr << "Oops! Something went wrong in the simulation library" << std::endl;
        }
        std::cerr << "Exception " << signal << " occured at " << sigInfo->si_addr << std::endl;

        /* Get the backtrace which lead to the error */
        numberAddresses = backtrace(gBuffer, BUFFER_SIZE);
        if (numberAddresses != 0)
        {
            /* Try to resolve symbols */
            strings = backtrace_symbols(gBuffer, numberAddresses);
            if (strings == 0)
            {
                numberAddresses = 0;
            }
        }

        /* Print the backtrace */
        for (trace = 0; trace < numberAddresses; ++trace)
        {
            std::cerr << (numberAddresses - 1 - trace) << ": " << strings[trace] << "\n";
        }

        /* No need for the lock any longer */
        pthread_mutex_unlock(&gHandlerLock);

        free(strings);
    }

    /* If we were in a try block, jump to the exception handler */
    if (gInTry)
    {
        longjmp(gJumpEnv, signal);
    }
}